

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O1

void __thiscall
vkt::QueryPool::anon_unknown_0::OcclusionQueryTestInstance::~OcclusionQueryTestInstance
          (OcclusionQueryTestInstance *this)

{
  ~OcclusionQueryTestInstance(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

OcclusionQueryTestInstance::~OcclusionQueryTestInstance (void)
{
	const vk::VkDevice device = m_context.getDevice();

	if (m_stateObjects)
		delete m_stateObjects;

	if (m_queryPool != DE_NULL)
	{
		const vk::DeviceInterface& vk = m_context.getDeviceInterface();
		vk.destroyQueryPool(device, m_queryPool, /*pAllocator*/ DE_NULL);
	}
}